

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HumanPlayer.cpp
# Opt level: O0

Card * __thiscall
HumanPlayer::makeDecision
          (HumanPlayer *this,vector<Card_*,_std::allocator<Card_*>_> *available_cards)

{
  Card *c_00;
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  reference ppCVar4;
  long *plVar5;
  size_type sVar6;
  ulong uVar7;
  reference ppCVar8;
  Card *card;
  Card *c;
  iterator __end1;
  iterator __begin1;
  vector<Card_*,_std::allocator<Card_*>_> *__range1;
  int local_38;
  int card_no;
  int i;
  Erase local_2c;
  Cursor local_24;
  vector<Card_*,_std::allocator<Card_*>_> *local_18;
  vector<Card_*,_std::allocator<Card_*>_> *available_cards_local;
  HumanPlayer *this_local;
  
  local_18 = available_cards;
  available_cards_local = (vector<Card_*,_std::allocator<Card_*>_> *)this;
  AdvancedConsole::Cursor::Cursor(&local_24,8,0,AC_ABSOLUTE);
  poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_24);
  AdvancedConsole::Erase::Erase(&local_2c,AC_ALL,AC_LINE);
  poVar3 = AdvancedConsole::operator<<(poVar3,&local_2c);
  poVar3 = std::operator<<(poVar3,"It\'s Player ");
  poVar3 = ::operator<<(poVar3,&this->super_Player);
  poVar3 = std::operator<<(poVar3,"\'s turn.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Player::displayHand(&this->super_Player,9);
  AdvancedConsole::Erase::Erase((Erase *)&card_no,AC_AFTER,AC_SCREEN);
  poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,(Erase *)&card_no);
  poVar3 = std::operator<<(poVar3,"Playable Cards: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_38 = 0;
  __range1._4_4_ = -1;
  __end1 = std::vector<Card_*,_std::allocator<Card_*>_>::begin(available_cards);
  c = (Card *)std::vector<Card_*,_std::allocator<Card_*>_>::end(available_cards);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>
                                     *)&c), bVar2) {
    ppCVar4 = __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::
              operator*(&__end1);
    iVar1 = local_38;
    c_00 = *ppCVar4;
    local_38 = local_38 + 1;
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = ::operator<<(poVar3,c_00);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::operator++
              (&__end1);
  }
  while( true ) {
    std::operator<<((ostream *)&std::cout,"Play: ");
    plVar5 = (long *)std::istream::operator>>(&std::cin,(int *)((long)&__range1 + 4));
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
    if (((bVar2) && (-1 < __range1._4_4_)) &&
       (uVar7 = (ulong)__range1._4_4_,
       sVar6 = std::vector<Card_*,_std::allocator<Card_*>_>::size(available_cards), uVar7 < sVar6))
    break;
    uVar7 = std::ios::fail();
    if ((uVar7 & 1) != 0) {
      std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
      std::istream::ignore();
    }
    std::operator<<((ostream *)&std::cout,"Incorrect entry. Try again: ");
  }
  ppCVar8 = std::vector<Card_*,_std::allocator<Card_*>_>::operator[]
                      (available_cards,(long)__range1._4_4_);
  return *ppCVar8;
}

Assistant:

Card *HumanPlayer::makeDecision(std::vector<Card *> available_cards) {
    cout << AdvancedConsole::Cursor(8, 0) << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE)
         << "It's Player " << *this << "'s turn." << endl;

    displayHand(9);

    cout << AdvancedConsole::Erase(AdvancedConsole::AC_AFTER) << "Playable Cards: " << endl;
    int i = 0, card_no = -1;
    for (Card *c: available_cards) {
        cout << i++ << ":" << *c << endl;
    }

    while (true) {
        cout << "Play: ";
        if (cin >> card_no && card_no >= 0 && card_no < available_cards.size()) {
            break;
        } else if (cin.fail()) {
            cin.clear();
            cin.ignore();
        }
        cout << "Incorrect entry. Try again: ";
    }

    Card *card = available_cards[card_no];
    return card;
}